

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

int unmatched_inclusions_warn(archive *matching,char *msg)

{
  wchar_t wVar1;
  int *piVar2;
  char *pcStack_28;
  int r;
  char *p;
  char *msg_local;
  archive *matching_local;
  
  p = msg;
  msg_local = (char *)matching;
  if (matching == (archive *)0x0) {
    matching_local._4_4_ = L'\0';
  }
  else {
    while (wVar1 = archive_match_path_unmatched_inclusions_next
                             ((archive *)msg_local,&stack0xffffffffffffffd8), wVar1 == L'\0') {
      lafe_warnc(0,"%s: %s",pcStack_28,p);
    }
    if (wVar1 == L'\xffffffe2') {
      piVar2 = __errno_location();
      lafe_errc(1,*piVar2,"Out of memory");
    }
    matching_local._4_4_ = archive_match_path_unmatched_inclusions((archive *)msg_local);
  }
  return matching_local._4_4_;
}

Assistant:

static int
unmatched_inclusions_warn(struct archive *matching, const char *msg)
{
	const char *p;
	int r;

	if (matching == NULL)
		return (0);

	while ((r = archive_match_path_unmatched_inclusions_next(
	    matching, &p)) == ARCHIVE_OK)
		lafe_warnc(0, "%s: %s", p, msg);
	if (r == ARCHIVE_FATAL)
		lafe_errc(1, errno, "Out of memory");

	return (archive_match_path_unmatched_inclusions(matching));
}